

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O0

void __thiscall Lexer_Integers_Test::TestBody(Lexer_Integers_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2d8;
  Message local_2d0;
  multi_tks local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_8;
  Message local_2a8;
  double local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_7;
  Message local_280;
  multi_tks local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_6;
  Message local_258;
  double local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_5;
  Message local_230;
  multi_tks local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_4;
  Message local_208;
  double local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_3;
  Message local_1e0;
  multi_tks local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_2;
  Message local_1b8;
  double local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_190;
  Message local_188 [3];
  multi_tks local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar;
  MockLexer mock;
  Lexer_Integers_Test *this_local;
  
  mock.lxr.tk.field_4 = (anon_union_8_2_0c43866c_for_TkInfo_4)this;
  mock_new((MockLexer *)&gtest_ar.message_,"3 0 1503 19993");
  lex_next((Lexer *)&mock.vm.stack_size);
  local_16c = TK_NUM;
  testing::internal::EqHelper<false>::Compare<int,multi_tks>
            ((EqHelper<false> *)local_168,"mock.lxr.tk.type","TK_NUM",&mock.lxr.cursor,&local_16c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=(&local_190,local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::Message::~Message(local_188);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_1b0 = 3.0;
    testing::internal::EqHelper<false>::Compare<double,double>
              ((EqHelper<false> *)local_1a8,"mock.lxr.tk.num","3.0",(double *)&mock.lxr.tk.length,
               &local_1b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
    if (!bVar1) {
      testing::Message::Message(&local_1b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                 ,0x82,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_1b8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      lex_next((Lexer *)&mock.vm.stack_size);
      local_1d4 = TK_NUM;
      testing::internal::EqHelper<false>::Compare<int,multi_tks>
                ((EqHelper<false> *)local_1d0,"mock.lxr.tk.type","TK_NUM",&mock.lxr.cursor,
                 &local_1d4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
      if (!bVar1) {
        testing::Message::Message(&local_1e0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                   ,0x83,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_1e0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_200 = 0.0;
        testing::internal::EqHelper<false>::Compare<double,double>
                  ((EqHelper<false> *)local_1f8,"mock.lxr.tk.num","0.0",
                   (double *)&mock.lxr.tk.length,&local_200);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
        if (!bVar1) {
          testing::Message::Message(&local_208);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                     ,0x84,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_208);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_208);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          lex_next((Lexer *)&mock.vm.stack_size);
          local_224 = TK_NUM;
          testing::internal::EqHelper<false>::Compare<int,multi_tks>
                    ((EqHelper<false> *)local_220,"mock.lxr.tk.type","TK_NUM",&mock.lxr.cursor,
                     &local_224);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
          if (!bVar1) {
            testing::Message::Message(&local_230);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                       ,0x85,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_230);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_230);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            local_250 = 1503.0;
            testing::internal::EqHelper<false>::Compare<double,double>
                      ((EqHelper<false> *)local_248,"mock.lxr.tk.num","1503.0",
                       (double *)&mock.lxr.tk.length,&local_250);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
            if (!bVar1) {
              testing::Message::Message(&local_258);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                         ,0x86,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_258);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_258);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
              lex_next((Lexer *)&mock.vm.stack_size);
              local_274 = TK_NUM;
              testing::internal::EqHelper<false>::Compare<int,multi_tks>
                        ((EqHelper<false> *)local_270,"mock.lxr.tk.type","TK_NUM",&mock.lxr.cursor,
                         &local_274);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
              if (!bVar1) {
                testing::Message::Message(&local_280);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                           ,0x87,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_280);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_280);
              }
              gtest_ar_1.message_.ptr_._5_3_ = 0;
              gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
              if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                local_2a0 = 19993.0;
                testing::internal::EqHelper<false>::Compare<double,double>
                          ((EqHelper<false> *)local_298,"mock.lxr.tk.num","19993.0",
                           (double *)&mock.lxr.tk.length,&local_2a0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_298);
                if (!bVar1) {
                  testing::Message::Message(&local_2a8);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                             ,0x88,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_2a8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_2a8);
                }
                gtest_ar_1.message_.ptr_._5_3_ = 0;
                gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
                if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                  lex_next((Lexer *)&mock.vm.stack_size);
                  local_2c4 = TK_EOF;
                  testing::internal::EqHelper<false>::Compare<int,multi_tks>
                            ((EqHelper<false> *)local_2c0,"mock.lxr.tk.type","TK_EOF",
                             &mock.lxr.cursor,&local_2c4);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2c0);
                  if (!bVar1) {
                    testing::Message::Message(&local_2d0);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2d8,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                               ,0x89,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
                    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
                    testing::Message::~Message(&local_2d0);
                  }
                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                    mock_free((MockLexer *)&gtest_ar.message_);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(Lexer, Integers) {
	MockLexer mock = mock_new("3 0 1503 19993");
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 3.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 0.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 1503.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 19993.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_EOF);
	mock_free(&mock);
}